

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O0

void tinyusdz::anon_unknown_28::swap8(int64_t *val)

{
  int64_t iVar1;
  uint8_t *src;
  uint8_t *dst;
  int64_t tmp;
  int64_t *val_local;
  
  iVar1 = *val;
  dst._7_1_ = (undefined1)((ulong)iVar1 >> 0x38);
  *(undefined1 *)val = dst._7_1_;
  dst._6_1_ = (undefined1)((ulong)iVar1 >> 0x30);
  *(undefined1 *)((long)val + 1) = dst._6_1_;
  dst._5_1_ = (undefined1)((ulong)iVar1 >> 0x28);
  *(undefined1 *)((long)val + 2) = dst._5_1_;
  dst._4_1_ = (undefined1)((ulong)iVar1 >> 0x20);
  *(undefined1 *)((long)val + 3) = dst._4_1_;
  dst._3_1_ = (undefined1)((ulong)iVar1 >> 0x18);
  *(undefined1 *)((long)val + 4) = dst._3_1_;
  dst._2_1_ = (undefined1)((ulong)iVar1 >> 0x10);
  *(undefined1 *)((long)val + 5) = dst._2_1_;
  dst._1_1_ = (undefined1)((ulong)iVar1 >> 8);
  *(undefined1 *)((long)val + 6) = dst._1_1_;
  dst._0_1_ = (undefined1)iVar1;
  *(undefined1 *)((long)val + 7) = dst._0_1_;
  return;
}

Assistant:

static inline void swap8(int64_t *val) {
  int64_t tmp = (*val);
  uint8_t *dst = reinterpret_cast<uint8_t *>(val);
  uint8_t *src = reinterpret_cast<uint8_t *>(&tmp);

  dst[0] = src[7];
  dst[1] = src[6];
  dst[2] = src[5];
  dst[3] = src[4];
  dst[4] = src[3];
  dst[5] = src[2];
  dst[6] = src[1];
  dst[7] = src[0];
}